

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O3

void rmd256(void *key,int len,uint32_t seed,void *out)

{
  rmd256_init(&ltc_state);
  ltc_state.rmd128.state[0] = seed ^ 0x67452301;
  rmd256_process(&ltc_state,(uchar *)key,(long)len);
  rmd256_done(&ltc_state,(uchar *)out);
  return;
}

Assistant:

inline void rmd256(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  rmd256_init(&ltc_state);
  ltc_state.rmd256.state[0] = 0x67452301UL ^ seed;
  rmd256_process(&ltc_state, (unsigned char *)key, len);
  rmd256_done(&ltc_state, (unsigned char *)out);
}